

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

DeviceType Diligent::RenderDeviceTypeToArchiveDeviceType(RENDER_DEVICE_TYPE Type)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  RENDER_DEVICE_TYPE Type_local;
  
  switch(Type) {
  case RENDER_DEVICE_TYPE_D3D11:
    msg.field_2._12_4_ = 1;
    break;
  case RENDER_DEVICE_TYPE_D3D12:
    msg.field_2._12_4_ = 2;
    break;
  case RENDER_DEVICE_TYPE_GL:
    msg.field_2._12_4_ = 0;
    break;
  case RENDER_DEVICE_TYPE_GLES:
    msg.field_2._12_4_ = 0;
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    msg.field_2._12_4_ = 3;
    break;
  default:
    msg.field_2._8_4_ = Type;
    FormatString<char[23]>((string *)local_30,(char (*) [23])"Unexpected device type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"RenderDeviceTypeToArchiveDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x3d);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 7;
    break;
  case RENDER_DEVICE_TYPE_WEBGPU:
    msg.field_2._12_4_ = 6;
  }
  return msg.field_2._12_4_;
}

Assistant:

DeviceObjectArchive::DeviceType RenderDeviceTypeToArchiveDeviceType(RENDER_DEVICE_TYPE Type)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new render device type? Please handle it here.");
    switch (Type)
    {
            // clang-format off
        case RENDER_DEVICE_TYPE_D3D11:  return DeviceObjectArchive::DeviceType::Direct3D11;
        case RENDER_DEVICE_TYPE_D3D12:  return DeviceObjectArchive::DeviceType::Direct3D12;
        case RENDER_DEVICE_TYPE_GL:     return DeviceObjectArchive::DeviceType::OpenGL;
        case RENDER_DEVICE_TYPE_GLES:   return DeviceObjectArchive::DeviceType::OpenGL;
        case RENDER_DEVICE_TYPE_VULKAN: return DeviceObjectArchive::DeviceType::Vulkan;
#if PLATFORM_MACOS
        case RENDER_DEVICE_TYPE_METAL:  return DeviceObjectArchive::DeviceType::Metal_MacOS;
#elif PLATFORM_IOS || PLATFORM_TVOS
        case RENDER_DEVICE_TYPE_METAL:  return DeviceObjectArchive::DeviceType::Metal_iOS;
#endif
        case RENDER_DEVICE_TYPE_WEBGPU:
            return DeviceObjectArchive::DeviceType::WebGPU;

        // clang-format on
        default:
            UNEXPECTED("Unexpected device type");
            return DeviceObjectArchive::DeviceType::Count;
    }
}